

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportSet.cxx
# Opt level: O0

void __thiscall cmExportSet::~cmExportSet(cmExportSet *this)

{
  cmExportSet *this_local;
  
  cmDeleteAll<std::vector<cmTargetExport*,std::allocator<cmTargetExport*>>>(&this->TargetExports);
  std::vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>::
  ~vector(&this->Installations);
  std::__cxx11::string::~string((string *)&this->Name);
  std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::~vector(&this->TargetExports);
  return;
}

Assistant:

cmExportSet::~cmExportSet()
{
  cmDeleteAll(this->TargetExports);
}